

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O2

int mp_check_ext_data_test(int8_t type,char *data,uint32_t len)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  
  if (type != 'B') {
    return 1;
  }
  uVar2 = len + 1;
  uVar1 = 0;
  do {
    uVar3 = uVar1;
    if (uVar3 == len) break;
    uVar2 = uVar2 - 1;
    uVar1 = uVar3 + 1;
  } while (uVar2 == (byte)data[uVar3]);
  return (int)(uVar3 < len);
}

Assistant:

int
mp_check_ext_data_test(int8_t type, const char *data, uint32_t len)
{
	if (type != 0x42)
		return 1;
	for (uint32_t i = 0; i < len; i++) {
		if ((unsigned char)data[i] != len - i)
			return 1;
	}
	return 0;
}